

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heuristics.cpp
# Opt level: O0

void __thiscall
Clasp::ClaspVsids_t<Clasp::DomScore>::updateVarActivity
          (ClaspVsids_t<Clasp::DomScore> *this,Solver *s,Var v,double f)

{
  bool bVar1;
  reference pDVar2;
  double *pdVar3;
  size_type in_EDX;
  key_type in_RDI;
  ClaspVsids_t<Clasp::DomScore> *this_00;
  double dVar4;
  double n;
  double o;
  undefined4 in_stack_ffffffffffffffb0;
  undefined3 in_stack_ffffffffffffffb4;
  Var v_00;
  Solver *in_stack_ffffffffffffffb8;
  indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore> *in_stack_ffffffffffffffc0;
  double local_38;
  
  v_00 = CONCAT13(1,in_stack_ffffffffffffffb4);
  if ((*(byte *)(in_RDI + 0x81) & 1) != 0) {
    Solver::varInfo(in_stack_ffffffffffffffb8,v_00);
    bVar1 = VarInfo::nant((VarInfo *)0x23b13c);
    v_00 = CONCAT13(bVar1,(int3)v_00);
  }
  if ((char)(v_00 >> 0x18) != '\0') {
    pDVar2 = bk_lib::pod_vector<Clasp::DomScore,_std::allocator<Clasp::DomScore>_>::operator[]
                       ((pod_vector<Clasp::DomScore,_std::allocator<Clasp::DomScore>_> *)
                        (in_RDI + 8),in_EDX);
    this_00 = (ClaspVsids_t<Clasp::DomScore> *)VsidsScore::get(&pDVar2->super_VsidsScore);
    dVar4 = DomScore::
            applyFactor<bk_lib::pod_vector<Clasp::DomScore,std::allocator<Clasp::DomScore>>>
                      ((pod_vector<Clasp::DomScore,_std::allocator<Clasp::DomScore>_> *)
                       in_stack_ffffffffffffffc0,(Var)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                       (double)CONCAT44(v_00,in_stack_ffffffffffffffb0));
    if ((*(byte *)(in_RDI + 0x80) & 1) == 0) {
      local_38 = dVar4 * *(double *)(in_RDI + 0x70) + (double)this_00;
    }
    else if ((dVar4 != 1.0) || (NAN(dVar4))) {
      if ((dVar4 == 0.0) && (!NAN(dVar4))) {
        return;
      }
      in_stack_ffffffffffffffc0 =
           (indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore> *)
           (((double)this_00 + *(double *)(in_RDI + 0x70) + dVar4) / 2.0);
      in_stack_ffffffffffffffb8 = (Solver *)(dVar4 + (double)this_00);
      pdVar3 = std::max<double>((double *)&stack0xffffffffffffffc0,
                                (double *)&stack0xffffffffffffffb8);
      local_38 = *pdVar3;
    }
    else {
      local_38 = ((double)this_00 + *(double *)(in_RDI + 0x70)) / 2.0;
    }
    pDVar2 = bk_lib::pod_vector<Clasp::DomScore,_std::allocator<Clasp::DomScore>_>::operator[]
                       ((pod_vector<Clasp::DomScore,_std::allocator<Clasp::DomScore>_> *)
                        (in_RDI + 8),in_EDX);
    VsidsScore::set(&pDVar2->super_VsidsScore,local_38);
    if (1e+100 < local_38) {
      normalize(this_00);
    }
    bVar1 = bk_lib::indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore>::
            is_in_queue(in_stack_ffffffffffffffc0,(key_type)in_stack_ffffffffffffffb8);
    if (bVar1) {
      if (local_38 < (double)this_00) {
        bk_lib::indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore>::decrease
                  ((indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore> *)
                   CONCAT44(v_00,in_stack_ffffffffffffffb0),in_RDI);
      }
      else {
        bk_lib::indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore>::increase
                  ((indexed_priority_queue<Clasp::ClaspVsids_t<Clasp::DomScore>::CmpScore> *)
                   CONCAT44(v_00,in_stack_ffffffffffffffb0),in_RDI);
      }
    }
  }
  return;
}

Assistant:

void ClaspVsids_t<ScoreType>::updateVarActivity(const Solver& s, Var v, double f) {
	if (!nant_ || s.varInfo(v).nant()) {
		double o = score_[v].get(), n;
		f = ScoreType::applyFactor(score_, v, f);
		if      (!acids_)  { n = o + (f * inc_); }
		else if (f == 1.0) { n = (o + inc_) / 2.0; }
		else if (f != 0.0) { n = std::max( (o + inc_ + f) / 2.0, f + o ); }
		else               { return; }
		score_[v].set(n);
		if (n > 1e100) { normalize(); }
		if (vars_.is_in_queue(v)) {
			if (n >= o) { vars_.increase(v); }
			else        { vars_.decrease(v); }
		}
	}
}